

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lista.hpp
# Opt level: O0

void __thiscall Lista<Lista<int>_>::eliminar(Lista<Lista<int>_> *this,Nat i)

{
  Nodo *pNVar1;
  Nodo *pNVar2;
  Nodo *this_00;
  Nodo *sig;
  Nodo *ant;
  Nodo *pNodo;
  Nat i_local;
  Lista<Lista<int>_> *this_local;
  
  this_00 = iesimoNodo(this,i);
  pNVar1 = this_00->_ant;
  pNVar2 = this_00->_sig;
  if (this_00 != (Nodo *)0x0) {
    Nodo::~Nodo(this_00);
    operator_delete(this_00);
  }
  if (pNVar1 == (Nodo *)0x0) {
    this->_prim = pNVar2;
  }
  else {
    pNVar1->_sig = pNVar2;
  }
  if (pNVar2 == (Nodo *)0x0) {
    this->_ult = pNVar1;
  }
  else {
    pNVar2->_ant = pNVar1;
  }
  return;
}

Assistant:

void Lista<T>::eliminar(Nat i) {
    Nodo *pNodo = this->iesimoNodo(i);
    Nodo *ant = pNodo->_ant;
    Nodo *sig = pNodo->_sig;

    delete pNodo;
    if(ant == nullptr) {
        this->_prim = sig;
    } else {
        ant->_sig = sig;
    }

    if(sig == nullptr) {
        this->_ult = ant;
    } else {
        sig->_ant = ant;
    }
}